

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  int local_24;
  int local_20;
  allocator<char> local_19;
  int status_value;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,&local_20,0);
      if (_Var1 != -1) goto LAB_0014af2e;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    this = (ForkingDeathTest *)&local_128;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,"CHECK failed: File ",&local_19);
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_88,&local_68,", line ");
    local_24 = 0x451;
    StreamableToString<int>(&local_48,&local_24);
    std::operator+(&local_a8,&local_88,&local_48);
    std::operator+(&local_c8,&local_a8,": ");
    std::operator+(&local_e8,&local_c8,"waitpid(child_pid_, &status_value, 0)");
    std::operator+(&local_108,&local_e8," != -1");
    DeathTestAbort(&local_108);
LAB_0014af2e:
    *(int *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)this + 0x20))->_M_string_length + 4) = local_20;
    iVar2 = local_20;
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}